

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

Expression * __thiscall
wasm::OptimizeInstructions::optimizePowerOf2Mul<unsigned_long>
          (OptimizeInstructions *this,Binary *binary,unsigned_long c)

{
  int iVar1;
  Const *pCVar2;
  anon_union_16_6_1532cd5a_for_Literal_0 local_30;
  undefined8 local_20;
  
  iVar1 = Bits::countTrailingZeroes(c);
  binary->op = ShlInt64;
  local_30.i64 = (int64_t)iVar1;
  local_20 = 3;
  pCVar2 = Expression::cast<wasm::Const>(binary->right);
  Literal::operator=(&pCVar2->value,(Literal *)&local_30.func);
  Literal::~Literal((Literal *)&local_30.func);
  return (Expression *)binary;
}

Assistant:

Expression* optimizePowerOf2Mul(Binary* binary, T c) {
    static_assert(std::is_same<T, uint32_t>::value ||
                    std::is_same<T, uint64_t>::value,
                  "type mismatch");
    auto shifts = Bits::countTrailingZeroes(c);
    binary->op = std::is_same<T, uint32_t>::value ? ShlInt32 : ShlInt64;
    binary->right->cast<Const>()->value = Literal(static_cast<T>(shifts));
    return binary;
  }